

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

void __thiscall re2c::Linear::emit(Linear *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  Cond *compare;
  size_type sVar1;
  reference pvVar2;
  uint local_2c;
  uint32_t i;
  bool *readCh_local;
  uint32_t ind_local;
  OutputFile *o_local;
  Linear *this_local;
  
  local_2c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
            ::size(&this->branches);
    if (sVar1 <= local_2c) break;
    pvVar2 = std::
             vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
             ::operator[](&this->branches,(ulong)local_2c);
    if (pvVar2->first == (Cond *)0x0) {
      pvVar2 = std::
               vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
               ::operator[](&this->branches,(ulong)local_2c);
      output_goto(o,ind,readCh,(label_t)(pvVar2->second->label).value);
    }
    else {
      pvVar2 = std::
               vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
               ::operator[](&this->branches,(ulong)local_2c);
      compare = pvVar2->first;
      pvVar2 = std::
               vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
               ::operator[](&this->branches,(ulong)local_2c);
      output_if(o,ind,readCh,&compare->compare,pvVar2->first->value);
      pvVar2 = std::
               vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
               ::operator[](&this->branches,(ulong)local_2c);
      output_goto(o,0,readCh,(label_t)(pvVar2->second->label).value);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Linear::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	for (uint32_t i = 0; i < branches.size (); ++i)
	{
		if (branches[i].first != NULL)
		{
			output_if (o, ind, readCh, branches[i].first->compare, branches[i].first->value);
			output_goto (o, 0, readCh, branches[i].second->label);
		}
		else
		{
			output_goto (o, ind, readCh, branches[i].second->label);
		}
	}
}